

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O2

int vorbis_synthesis_headerin(vorbis_info *vi,vorbis_comment *vc,ogg_packet *op)

{
  long *plVar1;
  void *pvVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  static_codebook *psVar9;
  char **ppcVar10;
  int *piVar11;
  long lVar12;
  vorbis_info_floor *pvVar13;
  vorbis_info_residue *pvVar14;
  vorbis_info_mapping *pvVar15;
  void *pvVar16;
  oggpack_buffer opb;
  char buffer [6];
  
  if (op == (ogg_packet *)0x0) {
    return -0x85;
  }
  oggpack_readinit(&opb,op->packet,(int)op->bytes);
  lVar5 = oggpack_read(&opb,8);
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  buffer[5] = '\0';
  _v_readstring(&opb,buffer,6);
  iVar3 = bcmp(buffer,"vorbis",6);
  if (iVar3 != 0) {
    return -0x84;
  }
  iVar3 = (int)lVar5;
  if (iVar3 == 5) {
    if (vi->rate == 0) {
      return -0x85;
    }
    if (vc->vendor == (char *)0x0) {
      return -0x85;
    }
    pvVar2 = vi->codec_setup;
    if (pvVar2 == (void *)0x0) {
      return -0x81;
    }
    if (0 < *(int *)((long)pvVar2 + 0x20)) {
      return -0x85;
    }
    lVar5 = oggpack_read(&opb,8);
    *(uint *)((long)pvVar2 + 0x20) = (uint)lVar5 + 1;
    if ((uint)lVar5 < 0x7fffffff) {
      lVar5 = 0;
      do {
        if (*(int *)((long)pvVar2 + 0x20) <= lVar5) {
          lVar5 = oggpack_read(&opb,6);
          if ((uint)lVar5 < 0x7fffffff) {
            iVar3 = (uint)lVar5 + 2;
            goto LAB_001b8d86;
          }
          break;
        }
        psVar9 = vorbis_staticbook_unpack(&opb);
        *(static_codebook **)((long)pvVar2 + lVar5 * 8 + 0xb28) = psVar9;
        lVar5 = lVar5 + 1;
      } while (psVar9 != (static_codebook *)0x0);
    }
  }
  else {
    if (iVar3 == 3) {
      if (vi->rate == 0) {
        return -0x85;
      }
      if (vc->vendor != (char *)0x0) {
        return -0x85;
      }
      lVar5 = oggpack_read(&opb,0x20);
      uVar4 = (uint)lVar5;
      if ((-1 < (int)uVar4) && ((long)(ulong)(uVar4 & 0x7fffffff) <= opb.storage + -8)) {
        pcVar6 = (char *)calloc((ulong)(uVar4 + 1),1);
        vc->vendor = pcVar6;
        _v_readstring(&opb,pcVar6,uVar4);
        uVar7 = oggpack_read(&opb,0x20);
        lVar5 = opb.storage;
        uVar4 = (uint)uVar7;
        if ((-1 < (int)uVar4) &&
           (lVar8 = oggpack_bytes(&opb), (long)(ulong)(uVar4 & 0x7fffffff) <= lVar5 - lVar8 >> 2)) {
          vc->comments = uVar4;
          ppcVar10 = (char **)calloc((ulong)(uVar4 + 1),8);
          vc->user_comments = ppcVar10;
          piVar11 = (int *)calloc((ulong)(uVar4 + 1),4);
          vc->comment_lengths = piVar11;
          for (lVar5 = 0; lVar5 < (int)uVar7; lVar5 = lVar5 + 1) {
            lVar12 = oggpack_read(&opb,0x20);
            lVar8 = opb.storage;
            uVar4 = (uint)lVar12;
            if (((int)uVar4 < 0) ||
               (lVar12 = oggpack_bytes(&opb), lVar8 - lVar12 < (long)(ulong)(uVar4 & 0x7fffffff)))
            goto LAB_001b8cd7;
            vc->comment_lengths[lVar5] = uVar4;
            pcVar6 = (char *)calloc((ulong)(uVar4 + 1),1);
            vc->user_comments[lVar5] = pcVar6;
            _v_readstring(&opb,vc->user_comments[lVar5],uVar4);
            uVar7 = (ulong)(uint)vc->comments;
          }
          lVar5 = oggpack_read(&opb,1);
          if (lVar5 == 1) {
            return 0;
          }
        }
      }
LAB_001b8cd7:
      vorbis_comment_clear(vc);
      return -0x85;
    }
    if (iVar3 != 1) {
      return -0x85;
    }
    if (op->b_o_s == 0) {
      return -0x85;
    }
    if (vi->rate != 0) {
      return -0x85;
    }
    plVar1 = (long *)vi->codec_setup;
    if (plVar1 == (long *)0x0) {
      return -0x81;
    }
    lVar5 = oggpack_read(&opb,0x20);
    vi->version = (int)lVar5;
    if ((int)lVar5 != 0) {
      return -0x86;
    }
    lVar5 = oggpack_read(&opb,8);
    vi->channels = (int)lVar5;
    lVar5 = oggpack_read(&opb,0x20);
    vi->rate = lVar5;
    lVar5 = oggpack_read(&opb,0x20);
    vi->bitrate_upper = (long)(int)lVar5;
    lVar5 = oggpack_read(&opb,0x20);
    vi->bitrate_nominal = (long)(int)lVar5;
    lVar5 = oggpack_read(&opb,0x20);
    vi->bitrate_lower = (long)(int)lVar5;
    lVar5 = oggpack_read(&opb,4);
    if (-1 < (int)lVar5) {
      *plVar1 = (long)(1 << ((byte)lVar5 & 0x1f));
      lVar5 = oggpack_read(&opb,4);
      if (-1 < (int)lVar5) {
        iVar3 = 1 << ((byte)lVar5 & 0x1f);
        plVar1[1] = (long)iVar3;
        if ((((0 < vi->rate) && (0 < vi->channels)) && (0x3f < *plVar1)) &&
           ((iVar3 < 0x2001 && (*plVar1 <= (long)iVar3)))) {
LAB_001b8c28:
          lVar5 = oggpack_read(&opb,1);
          if (lVar5 == 1) {
            return 0;
          }
        }
      }
    }
  }
LAB_001b8fdb:
  vorbis_info_clear(vi);
  return -0x85;
  while (lVar5 = oggpack_read(&opb,0x10), (int)lVar5 == 0) {
LAB_001b8d86:
    iVar3 = iVar3 + -1;
    if (iVar3 == 0) {
      lVar5 = oggpack_read(&opb,6);
      *(uint *)((long)pvVar2 + 0x18) = (uint)lVar5 + 1;
      if ((uint)lVar5 < 0x7fffffff) {
        lVar5 = 0;
        goto LAB_001b8e9c;
      }
      break;
    }
  }
  goto LAB_001b8fdb;
  while( true ) {
    lVar8 = oggpack_read(&opb,0x10);
    uVar4 = (uint)lVar8;
    *(uint *)((long)pvVar2 + lVar5 * 4 + 0x528) = uVar4;
    if (1 < uVar4) break;
    pvVar13 = (*_floor_P[uVar4 & 1]->unpack)(vi,&opb);
    *(vorbis_info_floor **)((long)pvVar2 + lVar5 * 8 + 0x628) = pvVar13;
    lVar5 = lVar5 + 1;
    if (pvVar13 == (vorbis_info_floor *)0x0) break;
LAB_001b8e9c:
    if (*(int *)((long)pvVar2 + 0x18) <= lVar5) {
      lVar5 = oggpack_read(&opb,6);
      *(uint *)((long)pvVar2 + 0x1c) = (uint)lVar5 + 1;
      if ((uint)lVar5 < 0x7fffffff) {
        lVar5 = 0;
        goto LAB_001b8f12;
      }
      break;
    }
  }
  goto LAB_001b8fdb;
  while( true ) {
    lVar8 = oggpack_read(&opb,0x10);
    uVar4 = (uint)lVar8;
    *(uint *)((long)pvVar2 + lVar5 * 4 + 0x828) = uVar4;
    if (2 < uVar4) break;
    pvVar14 = (*_residue_P[uVar4 & 3]->unpack)(vi,&opb);
    *(vorbis_info_residue **)((long)pvVar2 + lVar5 * 8 + 0x928) = pvVar14;
    lVar5 = lVar5 + 1;
    if (pvVar14 == (vorbis_info_residue *)0x0) break;
LAB_001b8f12:
    if (*(int *)((long)pvVar2 + 0x1c) <= lVar5) {
      lVar5 = oggpack_read(&opb,6);
      *(uint *)((long)pvVar2 + 0x14) = (uint)lVar5 + 1;
      if ((uint)lVar5 < 0x7fffffff) {
        lVar5 = 0;
        goto LAB_001b8f84;
      }
      break;
    }
  }
  goto LAB_001b8fdb;
  while( true ) {
    lVar8 = oggpack_read(&opb,0x10);
    *(int *)((long)pvVar2 + lVar5 * 4 + 0x228) = (int)lVar8;
    if ((int)lVar8 != 0) break;
    pvVar15 = mapping0_unpack(vi,&opb);
    *(vorbis_info_mapping **)((long)pvVar2 + lVar5 * 8 + 0x328) = pvVar15;
    lVar5 = lVar5 + 1;
    if (pvVar15 == (vorbis_info_mapping *)0x0) break;
LAB_001b8f84:
    if (*(int *)((long)pvVar2 + 0x14) <= lVar5) {
      lVar5 = oggpack_read(&opb,6);
      *(uint *)((long)pvVar2 + 0x10) = (uint)lVar5 + 1;
      if ((uint)lVar5 < 0x7fffffff) {
        lVar5 = 0;
        goto LAB_001b9006;
      }
      break;
    }
  }
  goto LAB_001b8fdb;
  while( true ) {
    pvVar16 = calloc(1,0x10);
    *(void **)((long)pvVar2 + lVar5 * 8 + 0x28) = pvVar16;
    lVar8 = oggpack_read(&opb,1);
    **(undefined4 **)((long)pvVar2 + lVar5 * 8 + 0x28) = (int)lVar8;
    lVar8 = oggpack_read(&opb,0x10);
    *(int *)(*(long *)((long)pvVar2 + lVar5 * 8 + 0x28) + 4) = (int)lVar8;
    lVar8 = oggpack_read(&opb,0x10);
    *(int *)(*(long *)((long)pvVar2 + lVar5 * 8 + 0x28) + 8) = (int)lVar8;
    lVar12 = oggpack_read(&opb,8);
    lVar8 = *(long *)((long)pvVar2 + lVar5 * 8 + 0x28);
    iVar3 = (int)lVar12;
    *(int *)(lVar8 + 0xc) = iVar3;
    if ((((0 < *(int *)(lVar8 + 4)) || (0 < *(int *)(lVar8 + 8))) || (iVar3 < 0)) ||
       (lVar5 = lVar5 + 1, *(int *)((long)pvVar2 + 0x14) <= iVar3)) break;
LAB_001b9006:
    if (*(int *)((long)pvVar2 + 0x10) <= lVar5) goto LAB_001b8c28;
  }
  goto LAB_001b8fdb;
}

Assistant:

int vorbis_synthesis_headerin(vorbis_info *vi,vorbis_comment *vc,ogg_packet *op){
  oggpack_buffer opb;

  if(op){
    oggpack_readinit(&opb,op->packet,op->bytes);

    /* Which of the three types of header is this? */
    /* Also verify header-ness, vorbis */
    {
      char buffer[6];
      int packtype=oggpack_read(&opb,8);
      memset(buffer,0,6);
      _v_readstring(&opb,buffer,6);
      if(memcmp(buffer,"vorbis",6)){
        /* not a vorbis header */
        return(OV_ENOTVORBIS);
      }
      switch(packtype){
      case 0x01: /* least significant *bit* is read first */
        if(!op->b_o_s){
          /* Not the initial packet */
          return(OV_EBADHEADER);
        }
        if(vi->rate!=0){
          /* previously initialized info header */
          return(OV_EBADHEADER);
        }

        return(_vorbis_unpack_info(vi,&opb));

      case 0x03: /* least significant *bit* is read first */
        if(vi->rate==0){
          /* um... we didn't get the initial header */
          return(OV_EBADHEADER);
        }
        if(vc->vendor!=NULL){
          /* previously initialized comment header */
          return(OV_EBADHEADER);
        }

        return(_vorbis_unpack_comment(vc,&opb));

      case 0x05: /* least significant *bit* is read first */
        if(vi->rate==0 || vc->vendor==NULL){
          /* um... we didn;t get the initial header or comments yet */
          return(OV_EBADHEADER);
        }
        if(vi->codec_setup==NULL){
          /* improperly initialized vorbis_info */
          return(OV_EFAULT);
        }
        if(((codec_setup_info *)vi->codec_setup)->books>0){
          /* previously initialized setup header */
          return(OV_EBADHEADER);
        }

        return(_vorbis_unpack_books(vi,&opb));

      default:
        /* Not a valid vorbis header type */
        return(OV_EBADHEADER);
        break;
      }
    }
  }
  return(OV_EBADHEADER);
}